

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O0

void __thiscall
soul::BlockBuilder::addAssignment(BlockBuilder *this,Expression *dest,Expression *source)

{
  CodeLocation local_38;
  Expression *local_20;
  Expression *source_local;
  Expression *dest_local;
  BlockBuilder *this_local;
  
  local_38.sourceCode.object = (SourceCodeText *)0x0;
  local_38.location.data = (char *)0x0;
  local_20 = source;
  source_local = dest;
  dest_local = (Expression *)this;
  CodeLocation::CodeLocation(&local_38);
  createStatement<soul::heart::AssignFromValue,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&>
            (this,&local_38,source_local,local_20);
  CodeLocation::~CodeLocation(&local_38);
  return;
}

Assistant:

void addAssignment (heart::Expression& dest, heart::Expression& source)
    {
        createStatement<heart::AssignFromValue> (CodeLocation(), dest, source);
    }